

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_parser_parseUnaryExpression(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t receiverPosition;
  bool bVar1;
  int iVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  size_t endPosition_1;
  sysbvm_tuple_t selector_1;
  size_t endPosition;
  sysbvm_tuple_t selector;
  sysbvm_tuple_t sStack_28;
  _Bool attemptToContinue;
  sysbvm_tuple_t receiver;
  size_t startPosition;
  sysbvm_parser_state_t *state_local;
  sysbvm_context_t *context_local;
  
  receiverPosition = state->tokenPosition;
  sStack_28 = sysbvm_parser_parsePrimaryExpression(context,state);
  bVar1 = true;
  do {
    while( true ) {
      if (!bVar1) {
        return sStack_28;
      }
      iVar2 = sysbvm_parser_lookKindAt(state,0);
      if (iVar2 - 2U < 0x1d || iVar2 == 0x1f) break;
switchD_001345fc_caseD_134749:
      bVar1 = false;
    }
    switch((long)&switchD_001345fc::switchdataD_0017d61c +
           (long)(int)(&switchD_001345fc::switchdataD_0017d61c)[iVar2 - 2U]) {
    case 0x1345fe:
      sVar3 = sysbvm_parser_parseLiteralTokenValue(context,state);
      sVar4 = sysbvm_parser_makeSourcePositionForTokenRange
                        (context,state->sourceCode,state->tokenSequence,receiverPosition,
                         state->tokenPosition);
      sStack_28 = sysbvm_parser_makeUnaryMessageSend(context,sVar4,sStack_28,sVar3);
      break;
    case 0x134660:
      sVar3 = sysbvm_parser_parseQuasiUnquote(context,state);
      sVar4 = sysbvm_parser_makeSourcePositionForTokenRange
                        (context,state->sourceCode,state->tokenSequence,receiverPosition,
                         state->tokenPosition);
      sStack_28 = sysbvm_parser_makeUnaryMessageSend(context,sVar4,sStack_28,sVar3);
      break;
    case 0x1346c2:
      sStack_28 = sysbvm_parser_parseCallExpressionWithReceiver
                            (context,state,sStack_28,receiverPosition);
      break;
    case 0x1346dd:
      sStack_28 = sysbvm_parser_parseApplyBlockExpressionWithReceiver
                            (context,state,sStack_28,receiverPosition);
      break;
    case 0x1346f8:
      sStack_28 = sysbvm_parser_parseSubscriptExpressionWithReceiver
                            (context,state,sStack_28,receiverPosition);
      break;
    case 0x134713:
      sStack_28 = sysbvm_parser_parseApplyByteArrayExpressionWithReceiver
                            (context,state,sStack_28,receiverPosition);
      break;
    case 0x13472e:
      sStack_28 = sysbvm_parser_parseApplyDictionaryWithReceiver
                            (context,state,sStack_28,receiverPosition);
      break;
    case 0x134749:
      goto switchD_001345fc_caseD_134749;
    }
  } while( true );
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseUnaryExpression(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    size_t startPosition = state->tokenPosition;

    sysbvm_tuple_t receiver = sysbvm_parser_parsePrimaryExpression(context, state);
    bool attemptToContinue = true;
    while(attemptToContinue)
    {
        switch(sysbvm_parser_lookKindAt(state, 0))
        {
        case SYSBVM_TOKEN_KIND_IDENTIFIER:
            {
                sysbvm_tuple_t selector = sysbvm_parser_parseLiteralTokenValue(context, state);
                size_t endPosition = state->tokenPosition;

                receiver = sysbvm_parser_makeUnaryMessageSend(context, sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition), receiver, selector);
            }
            break;
        case SYSBVM_TOKEN_KIND_QUASI_UNQUOTE:
            {
                sysbvm_tuple_t selector = sysbvm_parser_parseQuasiUnquote(context, state);
                size_t endPosition = state->tokenPosition;

                receiver = sysbvm_parser_makeUnaryMessageSend(context, sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition), receiver, selector);
            }
            break;
        case SYSBVM_TOKEN_KIND_LPARENT:
            receiver = sysbvm_parser_parseCallExpressionWithReceiver(context, state, receiver, startPosition);
            break;
        case SYSBVM_TOKEN_KIND_LCBRACKET:
            receiver = sysbvm_parser_parseApplyBlockExpressionWithReceiver(context, state, receiver, startPosition);
            break;
        case SYSBVM_TOKEN_KIND_LBRACKET:
            receiver = sysbvm_parser_parseSubscriptExpressionWithReceiver(context, state, receiver, startPosition);
            break;
        case SYSBVM_TOKEN_KIND_BYTE_ARRAY_START:
            receiver = sysbvm_parser_parseApplyByteArrayExpressionWithReceiver(context, state, receiver, startPosition);
            break;
        case SYSBVM_TOKEN_KIND_DICTIONARY_START:
            receiver = sysbvm_parser_parseApplyDictionaryWithReceiver(context, state, receiver, startPosition);
            break;
        default:
            attemptToContinue = false;
            break;
        }
    }

    return receiver;
}